

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.hpp
# Opt level: O2

void __thiscall astar::Map::Print(Map *this)

{
  ulong uVar1;
  int iVar2;
  long lVar3;
  ostream *poVar4;
  int i;
  long lVar5;
  int j_1;
  int j;
  long lVar6;
  
  poVar4 = std::operator<<((ostream *)&std::cout,"{");
  std::endl<char,std::char_traits<char>>(poVar4);
  lVar5 = 0;
  while( true ) {
    iVar2 = this->n;
    std::operator<<((ostream *)&std::cout,"{");
    if ((long)iVar2 + -1 <= lVar5) break;
    lVar6 = 0;
    while( true ) {
      lVar3 = *(long *)&(this->map).
                        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[lVar5].
                        super__Vector_base<int,_std::allocator<int>_>._M_impl;
      if ((long)this->m + -1 <= lVar6) break;
      poVar4 = (ostream *)
               std::ostream::operator<<((ostream *)&std::cout,*(int *)(lVar3 + lVar6 * 4));
      std::operator<<(poVar4,", ");
      lVar6 = lVar6 + 1;
    }
    poVar4 = (ostream *)
             std::ostream::operator<<
                       ((ostream *)&std::cout,*(int *)(lVar3 + -4 + (long)this->m * 4));
    poVar4 = std::operator<<(poVar4,"},");
    std::endl<char,std::char_traits<char>>(poVar4);
    lVar5 = lVar5 + 1;
  }
  lVar5 = 0;
  while( true ) {
    uVar1 = (long)this->m - 1;
    iVar2 = this->n;
    if ((long)uVar1 <= lVar5) break;
    poVar4 = (ostream *)
             std::ostream::operator<<
                       ((ostream *)&std::cout,
                        *(int *)(*(long *)&(this->map).
                                           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start
                                           [(long)iVar2 + -1].
                                           super__Vector_base<int,_std::allocator<int>_>._M_impl +
                                lVar5 * 4));
    std::operator<<(poVar4,", ");
    lVar5 = lVar5 + 1;
  }
  if (0 < this->m && 0 < iVar2) {
    poVar4 = (ostream *)
             std::ostream::operator<<
                       ((ostream *)&std::cout,
                        *(int *)(*(long *)&(this->map).
                                           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start
                                           [(long)iVar2 + -1].
                                           super__Vector_base<int,_std::allocator<int>_>._M_impl +
                                (uVar1 & 0xffffffff) * 4));
    poVar4 = std::operator<<(poVar4,"}\n}");
    std::endl<char,std::char_traits<char>>(poVar4);
    return;
  }
  return;
}

Assistant:

void Map::Print()
{
    std::cout << "{" << std::endl;
    for (int i = 0; i < (n - 1); i++) {
        std::cout << "{";
        for (int j = 0; j < (m - 1); j++) {
            std::cout << map[i][j] << ", ";
        }
        std::cout << map[i][m - 1] << "}," << std::endl;
    }
    std::cout << "{";
    for (int j = 0; j < (m - 1); j++) {
        std::cout << map[n - 1][j] << ", ";
    }
    if (n > 0 && m > 0) {
        std::cout << map[n - 1][m - 1] << "}\n}" << std::endl;
    }
}